

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6526Implementation.hpp
# Opt level: O2

ssize_t __thiscall
MOS::MOS6526::MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1>::write
          (MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *this,int __fd,
          void *__buf,size_t __n)

{
  byte bVar1;
  uint *puVar2;
  uint *extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  uint *extraout_RAX_02;
  ssize_t extraout_RAX_03;
  ssize_t extraout_RAX_04;
  ssize_t extraout_RAX_05;
  ssize_t extraout_RAX_06;
  ssize_t extraout_RAX_07;
  ssize_t extraout_RAX_08;
  byte bVar3;
  Counter *pCVar4;
  byte v;
  bool bVar5;
  ulong uVar6;
  Logger<(Log::Source)21> local_20 [8];
  
  uVar6 = (ulong)__buf & 0xffffffff;
  puVar2 = &switchD_001f9af4::switchdataD_00444f38;
  v = (byte)uVar6;
  switch(__fd & 0xf) {
  case 0:
    (this->super_MOS6526Storage).output_[0] = v;
    goto LAB_001f9b90;
  case 1:
    (this->super_MOS6526Storage).output_[1] = v;
    goto LAB_001f9bd3;
  case 2:
    (this->super_MOS6526Storage).data_direction_[0] = v;
LAB_001f9b90:
    set_port_output<0>(this);
    return extraout_RAX_01;
  case 3:
    (this->super_MOS6526Storage).data_direction_[1] = v;
LAB_001f9bd3:
    set_port_output<1>(this);
    return extraout_RAX_03;
  case 4:
    pCVar4 = (this->super_MOS6526Storage).counter_;
    goto LAB_001f9c2e;
  case 5:
    pCVar4 = (this->super_MOS6526Storage).counter_;
    goto LAB_001f9be7;
  case 6:
    pCVar4 = (this->super_MOS6526Storage).counter_ + 1;
LAB_001f9c2e:
    MOS6526Storage::Counter::set_reload<0,true>(pCVar4,v);
    return extraout_RAX_06;
  case 7:
    pCVar4 = (this->super_MOS6526Storage).counter_ + 1;
LAB_001f9be7:
    MOS6526Storage::Counter::set_reload<8,true>(pCVar4,v);
    return extraout_RAX_04;
  case 8:
    TODStorage<true>::write<0>(&this->tod_,v);
    return extraout_RAX_08;
  case 9:
    TODStorage<true>::write<1>(&this->tod_,v);
    return extraout_RAX_00;
  case 10:
    TODStorage<true>::write<2>(&this->tod_,v);
    return extraout_RAX_07;
  case 0xc:
    Log::Logger<(Log::Source)21>::error(local_20);
    Log::Logger<(Log::Source)21>::LogLine::append
              ((LogLine *)local_20,"TODO: write to shift register");
    Log::Logger<(Log::Source)21>::LogLine::~LogLine((LogLine *)local_20);
    puVar2 = extraout_RAX;
    break;
  case 0xd:
    bVar1 = (this->super_MOS6526Storage).interrupt_control_;
    bVar3 = ~v & bVar1;
    if ((char)v < '\0') {
      bVar3 = v & 0x7f | bVar1;
    }
    (this->super_MOS6526Storage).interrupt_control_ = bVar3;
    update_interrupts(this);
    return extraout_RAX_05;
  case 0xe:
    MOS6526Storage::Counter::set_control<false>((this->super_MOS6526Storage).counter_,v);
    puVar2 = (uint *)CONCAT71((int7)(uVar6 >> 8),v >> 7);
    (this->tod_).super_TODBase.is_50Hz = (bool)(v >> 7);
    bVar5 = (bool)(v >> 6 & 1);
    if ((this->super_MOS6526Storage).shifter_is_output_ != bVar5) {
      (this->super_MOS6526Storage).shifter_is_output_ = bVar5;
      (this->super_MOS6526Storage).shift_bits_ = 0;
    }
    break;
  case 0xf:
    MOS6526Storage::Counter::set_control<true>
              ((this->super_MOS6526Storage).counter_ + 1,(uint8_t)__buf);
    (this->tod_).super_TODBase.write_alarm = (bool)((byte)(uVar6 >> 7) & 1);
    puVar2 = extraout_RAX_02;
  }
  return (ssize_t)puVar2;
}

Assistant:

void MOS6526<BusHandlerT, personality>::write(int address, uint8_t value) {
	address &= 0xf;
	switch(address) {
		// Port output.
		case 0:
			output_[0] = value;
			set_port_output<0>();
		break;
		case 1:
			output_[1] = value;
			set_port_output<1>();
		break;

		// Port direction.
		case 2:
			data_direction_[0] = value;
			set_port_output<0>();
		break;
		case 3:
			data_direction_[1] = value;
			set_port_output<1>();
		break;

		// Counters; writes set the reload values.
		case 4:		counter_[0].template set_reload<0, personality == Personality::P8250>(value);	break;
		case 5:		counter_[0].template set_reload<8, personality == Personality::P8250>(value);	break;
		case 6:		counter_[1].template set_reload<0, personality == Personality::P8250>(value);	break;
		case 7:		counter_[1].template set_reload<8, personality == Personality::P8250>(value);	break;

		// Time-of-day clock.
		case 8:		tod_.template write<0>(value);	break;
		case 9:		tod_.template write<1>(value);	break;
		case 10:	tod_.template write<2>(value);	break;
		case 11:	tod_.template write<3>(value);	break;

		// Interrupt control.
		case 13: {
			if(value & 0x80) {
				interrupt_control_ |= value & 0x7f;
			} else {
				interrupt_control_ &= ~(value & 0x7f);
			}
			update_interrupts();
		} break;

		// Control. Posted to both the counters and the clock as it affects both.
		case 14:
			counter_[0].template set_control<false>(value);
			tod_.template set_control<false>(value);
			if(shifter_is_output_ != bool(value & 0x40)) {
				shifter_is_output_ = value & 0x40;
				shift_bits_ = 0;
			}
		break;
		case 15:
			counter_[1].template set_control<true>(value);
			tod_.template set_control<true>(value);
		break;

		// Shift control.
		case 12:
			log.error().append("TODO: write to shift register");
		break;

		// Logically unreachable.
		default: break;
	}
}